

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall Liby::TcpServer::handleErroEvent(TcpServer *this)

{
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
             (pointer)0x0);
  std::function<void_(Liby::Connection_&)>::operator=(&this->acceptorCallback_,(nullptr_t)0x0);
  std::function<void_(Liby::Connection_&)>::operator=(&this->readEventCallback_,(nullptr_t)0x0);
  std::function<void_(Liby::Connection_&)>::operator=(&this->erroEventCallback_,(nullptr_t)0x0);
  return;
}

Assistant:

void TcpServer::handleErroEvent() {
    chan_.reset();
    acceptorCallback_ = nullptr;
    readEventCallback_ = nullptr;
    erroEventCallback_ = nullptr;
}